

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall
Gluco::Clause::Clause<Gluco::vec<Gluco::Lit>>
          (Clause *this,vec<Gluco::Lit> *ps,bool use_extra,bool learnt)

{
  Lit *pLVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  
  uVar4 = (ulong)(uint)((int)CONCAT71(in_register_00000009,learnt) * 4);
  uVar5 = (int)CONCAT71(in_register_00000011,use_extra) << 3;
  *(ulong *)&this->header = *(ulong *)&this->header & 0xffffffffffffffe0 | (ulong)uVar5 | uVar4;
  uVar2 = ps->sz;
  *(ulong *)&this->header = CONCAT44(uVar2,uVar5) | uVar4 | 0x80000000;
  if (0 < ps->sz) {
    pLVar1 = ps->data;
    lVar6 = 0;
    do {
      *(int *)(&this[1].header.field_0x0 + lVar6 * 4) = pLVar1[lVar6].x;
      lVar6 = lVar6 + 1;
    } while (lVar6 < ps->sz);
  }
  if (use_extra) {
    if (!learnt) {
      uVar4 = *(ulong *)&this->header;
      if ((uVar4 & 8) == 0) {
        __assert_fail("header.has_extra",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SolverTypes.h"
                      ,0xaa,"void Gluco::Clause::calcAbstraction()");
      }
      if ((int)(uVar4 >> 0x20) < 1) {
        uVar2 = 0;
      }
      else {
        uVar3 = 0;
        uVar2 = 0;
        do {
          uVar2 = uVar2 | 1 << ((byte)(&this[1].header.field_0x0)[uVar3 * 4] >> 1 & 0x1f);
          uVar3 = uVar3 + 1;
        } while (uVar4 >> 0x20 != uVar3);
      }
      *(uint *)(&this[1].header.field_0x0 + (uVar4 >> 0x20) * 4) = uVar2;
      return;
    }
    *(undefined4 *)(&this[1].header.field_0x0 + (ulong)uVar2 * 4) = 0;
  }
  return;
}

Assistant:

Clause(const V& ps, bool use_extra, bool learnt) {
        header.mark      = 0;
        header.learnt    = learnt;
        header.has_extra = use_extra;
        header.reloced   = 0;
        header.size      = ps.size();
    header.lbd = 0;
    header.canbedel = 1;
        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];
    
        if (header.has_extra){
      if (header.learnt) 
                data[header.size].act = 0; 
            else 
                calcAbstraction(); }
    }